

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O2

LY_ERR lysp_stmt_list(lysp_ctx *ctx,lysp_stmt *stmt,lysp_node *parent,lysp_node **siblings)

{
  lysp_ext_instance **exts;
  char **siblings_00;
  uint16_t *flags;
  ly_stmt stmt_00;
  lysp_stmt *stmt_01;
  lyd_node *plVar1;
  int iVar2;
  LY_ERR LVar3;
  LY_ERR LVar4;
  lysp_node *parent_00;
  lysp_node *plVar5;
  char *pcVar6;
  char *format;
  uint32_t substmt_index;
  lysp_node *plVar7;
  ly_ctx *plVar8;
  lysp_ext_instance **in_R8;
  lysp_ext_instance **in_R9;
  lysp_stmt **pplVar9;
  
  LVar3 = lysp_stmt_validate_value(ctx,Y_IDENTIF_ARG,stmt->arg);
  if (LVar3 == LY_SUCCESS) {
    parent_00 = (lysp_node *)calloc(1,0x90);
    if (parent_00 == (lysp_node *)0x0) {
      if (ctx == (lysp_ctx *)0x0) {
        plVar8 = (ly_ctx *)0x0;
      }
      else {
        plVar8 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      LVar3 = LY_EMEM;
      ly_log(plVar8,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_stmt_list");
    }
    else {
      plVar7 = *siblings;
      if (*siblings != (lysp_node *)0x0) {
        do {
          plVar5 = plVar7;
          plVar7 = plVar5->next;
        } while (plVar7 != (lysp_node *)0x0);
        siblings = &plVar5->next;
      }
      *siblings = parent_00;
      if (ctx == (lysp_ctx *)0x0) {
        plVar8 = (ly_ctx *)0x0;
      }
      else {
        plVar8 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      LVar3 = lydict_insert(plVar8,stmt->arg,0,&parent_00->name);
      if (LVar3 == LY_SUCCESS) {
        parent_00->nodetype = 0x10;
        parent_00->parent = parent;
        exts = &parent_00->exts;
        siblings_00 = &parent_00[1].ref;
        flags = &parent_00->flags;
        iVar2 = (int)parent_00;
        LVar3 = LY_SUCCESS;
        pplVar9 = &stmt->child;
        while (stmt_01 = *pplVar9, stmt_01 != (lysp_stmt *)0x0) {
          stmt_00 = stmt_01->kw;
          if (stmt_00 == LY_STMT_NOTIFICATION) {
            plVar1 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
            if (*(byte *)&plVar1[2].schema < 2) {
              plVar8 = (ly_ctx *)**(undefined8 **)plVar1;
              pcVar6 = "notification";
LAB_00166ccf:
              format = 
              "Invalid keyword \"%s\" as a child of \"%s\" - the statement is allowed only in YANG 1.1 modules."
              ;
LAB_00166cfd:
              ly_vlog(plVar8,(char *)0x0,LYVE_SYNTAX_YANG,format,pcVar6,"list");
              return LY_EVALID;
            }
            LVar4 = lysp_stmt_notif(ctx,stmt_01,parent_00,(lysp_node_notif **)&parent_00[1].exts);
          }
          else if (stmt_00 == LY_STMT_ACTION) {
            plVar1 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
            if (*(byte *)&plVar1[2].schema < 2) {
              plVar8 = (ly_ctx *)**(undefined8 **)plVar1;
              pcVar6 = "action";
              goto LAB_00166ccf;
            }
            LVar4 = lysp_stmt_action(ctx,stmt_01,parent_00,
                                     (lysp_node_action **)&parent_00[1].iffeatures);
          }
          else {
            if (stmt_00 == LY_STMT_ANYDATA) {
              plVar1 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
              if (*(byte *)&plVar1[2].schema < 2) {
                plVar8 = (ly_ctx *)**(undefined8 **)plVar1;
                pcVar6 = "anydata";
                goto LAB_00166ccf;
              }
            }
            else if (stmt_00 != LY_STMT_ANYXML) {
              if (stmt_00 == LY_STMT_CHOICE) {
                LVar4 = lysp_stmt_choice(ctx,stmt_01,parent_00,(lysp_node **)siblings_00);
              }
              else if (stmt_00 == LY_STMT_CONTAINER) {
                LVar4 = lysp_stmt_container(ctx,stmt_01,parent_00,(lysp_node **)siblings_00);
              }
              else if (stmt_00 == LY_STMT_GROUPING) {
                LVar4 = lysp_stmt_grouping(ctx,stmt_01,parent_00,(lysp_node_grp **)&parent_00[1].dsc
                                          );
              }
              else if (stmt_00 == LY_STMT_LEAF) {
                LVar4 = lysp_stmt_leaf(ctx,stmt_01,parent_00,(lysp_node **)siblings_00);
              }
              else if (stmt_00 == LY_STMT_LEAF_LIST) {
                LVar4 = lysp_stmt_leaflist(ctx,stmt_01,parent_00,(lysp_node **)siblings_00);
              }
              else if (stmt_00 == LY_STMT_LIST) {
                LVar4 = lysp_stmt_list(ctx,stmt_01,parent_00,(lysp_node **)siblings_00);
              }
              else if (stmt_00 == LY_STMT_USES) {
                LVar4 = lysp_stmt_uses(ctx,stmt_01,parent_00,(lysp_node **)siblings_00);
              }
              else if (stmt_00 == LY_STMT_WHEN) {
                LVar4 = lysp_stmt_when(ctx,stmt_01,(lysp_when **)&parent_00[1].nodetype);
              }
              else {
                substmt_index = iVar2 + 0x20;
                if (stmt_00 == LY_STMT_DESCRIPTION) {
LAB_00166bb4:
                  in_R8 = exts;
                  LVar4 = lysp_stmt_text_field
                                    (ctx,stmt_01,substmt_index,(char **)0x2,(yang_arg)exts,in_R9);
                }
                else if (stmt_00 == LY_STMT_EXTENSION_INSTANCE) {
                  in_R8 = exts;
                  LVar4 = lysp_stmt_ext(ctx,stmt_01,LY_STMT_LIST,0,exts);
                }
                else {
                  plVar7 = (lysp_node *)&parent_00->iffeatures;
                  if (stmt_00 == LY_STMT_IF_FEATURE) {
LAB_00166b9c:
                    LVar4 = lysp_stmt_qnames(ctx,stmt_01,(lysp_qname **)plVar7,(yang_arg)exts,in_R8)
                    ;
                  }
                  else {
                    substmt_index = iVar2 + 0x50;
                    if (stmt_00 == LY_STMT_KEY) goto LAB_00166bb4;
                    if (stmt_00 == LY_STMT_MAX_ELEMENTS) {
                      in_R8 = exts;
                      LVar4 = lysp_stmt_maxelements
                                        (ctx,stmt_01,(uint32_t *)&parent_00[2].field_0xc,flags,exts)
                      ;
                    }
                    else if (stmt_00 == LY_STMT_MIN_ELEMENTS) {
                      in_R8 = exts;
                      LVar4 = lysp_stmt_minelements
                                        (ctx,stmt_01,(uint32_t *)&parent_00[2].nodetype,flags,exts);
                    }
                    else if (stmt_00 == LY_STMT_MUST) {
                      LVar4 = lysp_stmt_restrs(ctx,stmt_01,(lysp_restr **)(parent_00 + 1));
                    }
                    else if (stmt_00 == LY_STMT_ORDERED_BY) {
                      LVar4 = lysp_stmt_orderedby(ctx,stmt_01,flags,exts);
                    }
                    else {
                      substmt_index = iVar2 + 0x28;
                      if (stmt_00 == LY_STMT_REFERENCE) goto LAB_00166bb4;
                      if (stmt_00 == LY_STMT_STATUS) {
                        LVar4 = lysp_stmt_status(ctx,stmt_01,flags,exts);
                      }
                      else if (stmt_00 == LY_STMT_TYPEDEF) {
                        LVar4 = lysp_stmt_typedef(ctx,stmt_01,parent_00,
                                                  (lysp_tpdf **)&parent_00[1].name);
                      }
                      else {
                        plVar7 = parent_00 + 2;
                        if (stmt_00 == LY_STMT_UNIQUE) goto LAB_00166b9c;
                        if (stmt_00 != LY_STMT_CONFIG) {
                          if (ctx == (lysp_ctx *)0x0) {
                            plVar8 = (ly_ctx *)0x0;
                          }
                          else {
                            plVar8 = (ly_ctx *)
                                     **(undefined8 **)
                                       (ctx->parsed_mods->field_2).dnodes
                                       [ctx->parsed_mods->count - 1];
                          }
                          pcVar6 = lyplg_ext_stmt2str(stmt_00);
                          format = "Invalid keyword \"%s\" as a child of \"%s\".";
                          goto LAB_00166cfd;
                        }
                        LVar4 = lysp_stmt_config(ctx,stmt_01,flags,exts);
                      }
                    }
                  }
                }
              }
              goto LAB_00166c3b;
            }
            LVar4 = lysp_stmt_any(ctx,stmt_01,parent_00,(lysp_node **)siblings_00);
          }
LAB_00166c3b:
          if (LVar4 != LY_SUCCESS) {
            return LVar4;
          }
          pplVar9 = &stmt_01->next;
        }
      }
    }
  }
  return LVar3;
}

Assistant:

static LY_ERR
lysp_stmt_list(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, struct lysp_node *parent,
        struct lysp_node **siblings)
{
    struct lysp_node_list *list;

    LY_CHECK_RET(lysp_stmt_validate_value(ctx, Y_IDENTIF_ARG, stmt->arg));

    /* create new list structure */
    LY_LIST_NEW_RET(PARSER_CTX(ctx), siblings, list, next, LY_EMEM);

    LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), stmt->arg, 0, &list->name));
    list->nodetype = LYS_LIST;
    list->parent = parent;

    /* parse substatements */
    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_CONFIG:
            LY_CHECK_RET(lysp_stmt_config(ctx, child, &list->flags, &list->exts));
            break;
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &list->dsc, Y_STR_ARG, &list->exts));
            break;
        case LY_STMT_IF_FEATURE:
            LY_CHECK_RET(lysp_stmt_qnames(ctx, child, &list->iffeatures, Y_STR_ARG, &list->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &list->ref, Y_STR_ARG, &list->exts));
            break;
        case LY_STMT_STATUS:
            LY_CHECK_RET(lysp_stmt_status(ctx, child, &list->flags, &list->exts));
            break;
        case LY_STMT_WHEN:
            LY_CHECK_RET(lysp_stmt_when(ctx, child, &list->when));
            break;
        case LY_STMT_KEY:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &list->key, Y_STR_ARG, &list->exts));
            break;
        case LY_STMT_MAX_ELEMENTS:
            LY_CHECK_RET(lysp_stmt_maxelements(ctx, child, &list->max, &list->flags, &list->exts));
            break;
        case LY_STMT_MIN_ELEMENTS:
            LY_CHECK_RET(lysp_stmt_minelements(ctx, child, &list->min, &list->flags, &list->exts));
            break;
        case LY_STMT_ORDERED_BY:
            LY_CHECK_RET(lysp_stmt_orderedby(ctx, child, &list->flags, &list->exts));
            break;
        case LY_STMT_UNIQUE:
            LY_CHECK_RET(lysp_stmt_qnames(ctx, child, &list->uniques, Y_STR_ARG, &list->exts));
            break;

        case LY_STMT_ANYDATA:
            PARSER_CHECK_STMTVER2_RET(ctx, "anydata", "list");
        /* fall through */
        case LY_STMT_ANYXML:
            LY_CHECK_RET(lysp_stmt_any(ctx, child, &list->node, &list->child));
            break;
        case LY_STMT_CHOICE:
            LY_CHECK_RET(lysp_stmt_choice(ctx, child, &list->node, &list->child));
            break;
        case LY_STMT_CONTAINER:
            LY_CHECK_RET(lysp_stmt_container(ctx, child, &list->node, &list->child));
            break;
        case LY_STMT_LEAF:
            LY_CHECK_RET(lysp_stmt_leaf(ctx, child, &list->node, &list->child));
            break;
        case LY_STMT_LEAF_LIST:
            LY_CHECK_RET(lysp_stmt_leaflist(ctx, child, &list->node, &list->child));
            break;
        case LY_STMT_LIST:
            LY_CHECK_RET(lysp_stmt_list(ctx, child, &list->node, &list->child));
            break;
        case LY_STMT_USES:
            LY_CHECK_RET(lysp_stmt_uses(ctx, child, &list->node, &list->child));
            break;

        case LY_STMT_TYPEDEF:
            LY_CHECK_RET(lysp_stmt_typedef(ctx, child, &list->node, &list->typedefs));
            break;
        case LY_STMT_MUST:
            LY_CHECK_RET(lysp_stmt_restrs(ctx, child, &list->musts));
            break;
        case LY_STMT_ACTION:
            PARSER_CHECK_STMTVER2_RET(ctx, "action", "list");
            LY_CHECK_RET(lysp_stmt_action(ctx, child, &list->node, &list->actions));
            break;
        case LY_STMT_GROUPING:
            LY_CHECK_RET(lysp_stmt_grouping(ctx, child, &list->node, &list->groupings));
            break;
        case LY_STMT_NOTIFICATION:
            PARSER_CHECK_STMTVER2_RET(ctx, "notification", "list");
            LY_CHECK_RET(lysp_stmt_notif(ctx, child, &list->node, &list->notifs));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, LY_STMT_LIST, 0, &list->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw), "list");
            return LY_EVALID;
        }
    }

    return LY_SUCCESS;
}